

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O2

bool __thiscall HighsCallback::callbackAction(HighsCallback *this,int callback_type,string *message)

{
  bool bVar1;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = callbackActive(this,callback_type);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(message->_M_dataplus)._M_p,&local_41);
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::operator()(&this->user_callback,callback_type,&local_40,&this->data_out,
                 (anon_struct_16_2_bb6a87e9 *)&this->data_in,this->user_callback_data);
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = (this->data_in).user_interrupt != 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HighsCallback::callbackAction(const int callback_type,
                                   std::string message) {
  if (!callbackActive(callback_type)) return false;
  this->user_callback(callback_type, message.c_str(), &this->data_out,
                      &this->data_in, this->user_callback_data);
  // Assess any action
  bool action = this->data_in.user_interrupt;

  // Check for no action if case not handled internally
  if (callback_type == kCallbackMipImprovingSolution ||
      callback_type == kCallbackMipSolution ||
      callback_type == kCallbackMipLogging ||
      callback_type == kCallbackMipGetCutPool ||
      callback_type == kCallbackMipDefineLazyConstraints ||
      callback_type == kCallbackMipUserSolution)
    assert(!action);
  return action;
}